

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O0

void ngx_pool_run_cleanup_file(ngx_pool_t *p,ngx_fd_t fd)

{
  ngx_pool_cleanup_file_t *cf;
  ngx_pool_cleanup_t *c;
  ngx_fd_t fd_local;
  ngx_pool_t *p_local;
  
  cf = (ngx_pool_cleanup_file_t *)p->cleanup;
  while( true ) {
    if (cf == (ngx_pool_cleanup_file_t *)0x0) {
      return;
    }
    if ((*(code **)cf == ngx_pool_cleanup_file) && (*(int *)cf->name == fd)) break;
    cf = (ngx_pool_cleanup_file_t *)cf->log;
  }
  (**(code **)cf)(cf->name);
  *(undefined8 *)cf = 0;
  return;
}

Assistant:

void
ngx_pool_run_cleanup_file(ngx_pool_t *p, ngx_fd_t fd)
{
    ngx_pool_cleanup_t       *c;
    ngx_pool_cleanup_file_t  *cf;

    for (c = p->cleanup; c; c = c->next) {
        if (c->handler == ngx_pool_cleanup_file) {

            cf = c->data;

            if (cf->fd == fd) {
                c->handler(cf);
                c->handler = NULL;
                return;
            }
        }
    }
}